

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O3

void L3_imdct36(float *grbuf,float *overlap,float *window,int nbands)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  bool bVar25;
  bool bVar26;
  uint uVar27;
  long lVar28;
  float *pfVar29;
  float *pfVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float si [9];
  float co [9];
  float local_88;
  uint uStack_84;
  uint uStack_7c;
  float local_78;
  float local_74 [5];
  ulong local_60;
  float local_58 [8];
  float local_38;
  
  if (0 < nbands) {
    local_60 = 0;
    do {
      local_58[0] = -*grbuf;
      local_88 = grbuf[0x11];
      lVar28 = 4;
      pfVar29 = local_74;
      do {
        pfVar30 = (float *)((long)grbuf + lVar28 * 2 + -4);
        fVar2 = *pfVar30;
        fVar31 = pfVar30[1];
        fVar3 = pfVar30[2];
        fVar4 = pfVar30[3];
        pfVar30 = (float *)((long)grbuf + lVar28 * 2 + 0xc);
        fVar5 = *pfVar30;
        fVar6 = pfVar30[1];
        fVar7 = pfVar30[2];
        fVar8 = pfVar30[3];
        *pfVar29 = fVar8 - fVar7;
        pfVar29[1] = fVar5 - fVar6;
        pfVar29[2] = fVar4 - fVar3;
        pfVar29[3] = fVar2 - fVar31;
        *(float *)((long)local_58 + lVar28) = fVar31 + fVar2;
        *(float *)((long)local_58 + lVar28 + 4) = -(fVar4 + fVar3);
        *(float *)((long)local_58 + lVar28 + 8) = fVar6 + fVar5;
        *(float *)((long)local_58 + lVar28 + 0xc) = -(fVar8 + fVar7);
        lVar28 = lVar28 + 0x10;
        pfVar29 = pfVar29 + -4;
      } while (lVar28 != 0x24);
      L3_dct3_9(local_58);
      L3_dct3_9(&local_88);
      uStack_84 = uStack_84 ^ 0x80000000;
      uStack_7c = uStack_7c ^ 0x80000000;
      local_74[0] = -local_74[0];
      local_74[2] = (float)((uint)local_74[2] ^ 0x80000000);
      lVar28 = 0;
      pfVar29 = &local_88;
      pfVar30 = local_58;
      bVar25 = true;
      do {
        bVar26 = bVar25;
        pfVar1 = overlap + lVar28;
        fVar2 = *pfVar1;
        fVar31 = pfVar1[1];
        fVar3 = pfVar1[2];
        fVar4 = pfVar1[3];
        fVar5 = pfVar30[1];
        fVar6 = pfVar30[2];
        fVar7 = pfVar30[3];
        fVar8 = pfVar29[1];
        fVar9 = pfVar29[2];
        fVar10 = pfVar29[3];
        fVar11 = L3_imdct36::g_twid9[lVar28 + 1];
        fVar12 = L3_imdct36::g_twid9[lVar28 + 2];
        fVar13 = L3_imdct36::g_twid9[lVar28 + 3];
        fVar14 = L3_imdct36::g_twid9[lVar28 + 10];
        fVar15 = L3_imdct36::g_twid9[lVar28 + 0xb];
        fVar16 = L3_imdct36::g_twid9[lVar28 + 0xc];
        pfVar1 = window + lVar28;
        fVar17 = *pfVar1;
        fVar18 = pfVar1[1];
        fVar19 = pfVar1[2];
        fVar20 = pfVar1[3];
        pfVar1 = window + lVar28 + 9;
        fVar21 = *pfVar1;
        fVar22 = pfVar1[1];
        fVar23 = pfVar1[2];
        fVar24 = pfVar1[3];
        fVar32 = *pfVar29 * L3_imdct36::g_twid9[lVar28] + *pfVar30 * L3_imdct36::g_twid9[lVar28 + 9]
        ;
        fVar33 = fVar8 * fVar11 + fVar5 * fVar14;
        fVar34 = fVar9 * fVar12 + fVar6 * fVar15;
        fVar35 = fVar10 * fVar13 + fVar7 * fVar16;
        pfVar1 = overlap + lVar28;
        *pfVar1 = *pfVar30 * L3_imdct36::g_twid9[lVar28] -
                  *pfVar29 * L3_imdct36::g_twid9[lVar28 + 9];
        pfVar1[1] = fVar5 * fVar11 - fVar8 * fVar14;
        pfVar1[2] = fVar6 * fVar12 - fVar9 * fVar15;
        pfVar1[3] = fVar7 * fVar13 - fVar10 * fVar16;
        pfVar29 = grbuf + lVar28;
        *pfVar29 = fVar2 * fVar17 - fVar32 * fVar21;
        pfVar29[1] = fVar31 * fVar18 - fVar33 * fVar22;
        pfVar29[2] = fVar3 * fVar19 - fVar34 * fVar23;
        pfVar29[3] = fVar4 * fVar20 - fVar35 * fVar24;
        grbuf[0xe - lVar28] = fVar4 * fVar24 + fVar20 * fVar35;
        grbuf[0xf - lVar28] = fVar3 * fVar23 + fVar19 * fVar34;
        grbuf[0x10 - lVar28] = fVar31 * fVar22 + fVar18 * fVar33;
        grbuf[0x11 - lVar28] = fVar2 * fVar21 + fVar17 * fVar32;
        lVar28 = 4;
        pfVar29 = &local_78;
        pfVar30 = local_58 + 4;
        bVar25 = false;
      } while (bVar26);
      fVar2 = overlap[8];
      fVar31 = local_38 * 0.04361938 + local_74[3] * 0.99904823;
      overlap[8] = local_38 * 0.99904823 + local_74[3] * -0.04361938;
      grbuf[8] = window[8] * fVar2 - window[0x11] * fVar31;
      grbuf[9] = fVar2 * window[0x11] + fVar31 * window[8];
      uVar27 = (int)local_60 + 1;
      local_60 = (ulong)uVar27;
      grbuf = grbuf + 0x12;
      overlap = overlap + 9;
    } while (uVar27 != nbands);
  }
  return;
}

Assistant:

static void L3_imdct36(float *grbuf, float *overlap, const float *window, int nbands)
{
    int i, j;
    static const float g_twid9[18] = {
        0.73727734f,0.79335334f,0.84339145f,0.88701083f,0.92387953f,0.95371695f,0.97629601f,0.99144486f,0.99904822f,0.67559021f,0.60876143f,0.53729961f,0.46174861f,0.38268343f,0.30070580f,0.21643961f,0.13052619f,0.04361938f
    };

    for (j = 0; j < nbands; j++, grbuf += 18, overlap += 9)
    {
        float co[9], si[9];
        co[0] = -grbuf[0];
        si[0] = grbuf[17];
        for (i = 0; i < 4; i++)
        {
            si[8 - 2*i] =   grbuf[4*i + 1] - grbuf[4*i + 2];
            co[1 + 2*i] =   grbuf[4*i + 1] + grbuf[4*i + 2];
            si[7 - 2*i] =   grbuf[4*i + 4] - grbuf[4*i + 3];
            co[2 + 2*i] = -(grbuf[4*i + 3] + grbuf[4*i + 4]);
        }
        L3_dct3_9(co);
        L3_dct3_9(si);

        si[1] = -si[1];
        si[3] = -si[3];
        si[5] = -si[5];
        si[7] = -si[7];

        i = 0;

#if HAVE_SIMD
        if (have_simd()) for (; i < 8; i += 4)
        {
            f4 vovl = VLD(overlap + i);
            f4 vc = VLD(co + i);
            f4 vs = VLD(si + i);
            f4 vr0 = VLD(g_twid9 + i);
            f4 vr1 = VLD(g_twid9 + 9 + i);
            f4 vw0 = VLD(window + i);
            f4 vw1 = VLD(window + 9 + i);
            f4 vsum = VADD(VMUL(vc, vr1), VMUL(vs, vr0));
            VSTORE(overlap + i, VSUB(VMUL(vc, vr0), VMUL(vs, vr1)));
            VSTORE(grbuf + i, VSUB(VMUL(vovl, vw0), VMUL(vsum, vw1)));
            vsum = VADD(VMUL(vovl, vw1), VMUL(vsum, vw0));
            VSTORE(grbuf + 14 - i, VREV(vsum));
        }
#endif /* HAVE_SIMD */
        for (; i < 9; i++)
        {
            float ovl  = overlap[i];
            float sum  = co[i]*g_twid9[9 + i] + si[i]*g_twid9[0 + i];
            overlap[i] = co[i]*g_twid9[0 + i] - si[i]*g_twid9[9 + i];
            grbuf[i]      = ovl*window[0 + i] - sum*window[9 + i];
            grbuf[17 - i] = ovl*window[9 + i] + sum*window[0 + i];
        }
    }
}